

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part.c
# Opt level: O0

exr_result_t exr_get_tile_levels(exr_const_context_t ctxt,int part_index,int *levelsx,int *levelsy)

{
  int iVar1;
  int iVar2;
  exr_const_context_t c;
  long lVar3;
  long lVar4;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_const_priv_part_t part;
  exr_const_context_t in_stack_ffffffffffffffd0;
  exr_result_t local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    if (*in_RDI == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffd0);
    }
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      if (*in_RDI == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
      }
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      iVar1._0_1_ = c->has_nonimage_data;
      iVar1._1_1_ = c->is_multipart;
      iVar1._2_1_ = c->strict_header;
      iVar1._3_1_ = c->silent_header;
      if ((iVar1 == 1) ||
         (iVar2._0_1_ = c->has_nonimage_data, iVar2._1_1_ = c->is_multipart,
         iVar2._2_1_ = c->strict_header, iVar2._3_1_ = c->silent_header, iVar2 == 3)) {
        if (((c->free_fn == (exr_memory_free_func_t)0x0) ||
            (((c->output_chunk_count < 1 || (c->num_parts < 1)) ||
             (lVar3._0_4_ = (c->first_part).part_index, lVar3._4_4_ = (c->first_part).storage_mode,
             lVar3 == 0)))) ||
           (lVar4._0_4_ = (c->first_part).attributes.num_attributes,
           lVar4._4_4_ = (c->first_part).attributes.num_alloced, lVar4 == 0)) {
          if (*in_RDI == '\x01') {
            internal_exr_unlock(c);
          }
          local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,0xd,"Tile data missing or corrupt");
        }
        else {
          if (in_RDX != (int *)0x0) {
            *in_RDX = c->output_chunk_count;
          }
          if (in_RCX != (int *)0x0) {
            *in_RCX = c->num_parts;
          }
          if (*in_RDI == '\x01') {
            internal_exr_unlock(c);
          }
          local_4 = 0;
        }
      }
      else {
        if (*in_RDI == '\x01') {
          internal_exr_unlock(c);
        }
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x13);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_tile_levels (
    exr_const_context_t ctxt, int part_index, int* levelsx, int* levelsy)
{
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (!part->tiles || part->num_tile_levels_x <= 0 ||
            part->num_tile_levels_y <= 0 || !part->tile_level_tile_count_x ||
            !part->tile_level_tile_count_y)
        {
            return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Tile data missing or corrupt"));
        }

        if (levelsx) *levelsx = part->num_tile_levels_x;
        if (levelsy) *levelsy = part->num_tile_levels_y;
        return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
    }

    return EXR_UNLOCK_WRITE_AND_RETURN (
        ctxt->standard_error (ctxt, EXR_ERR_TILE_SCAN_MIXEDAPI));
}